

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btCollisionWorld::rayTest
          (btCollisionWorld *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          RayResultCallback *resultCallback)

{
  btSingleRayCallback rayCB;
  btSingleRayCallback local_108;
  
  btSingleRayCallback::btSingleRayCallback(&local_108,rayFromWorld,rayToWorld,this,resultCallback);
  (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[6])
            (this->m_broadphasePairCache,rayFromWorld,rayToWorld,&local_108);
  return;
}

Assistant:

void	btCollisionWorld::rayTest(const btVector3& rayFromWorld, const btVector3& rayToWorld, RayResultCallback& resultCallback) const
{
	//BT_PROFILE("rayTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	btSingleRayCallback rayCB(rayFromWorld,rayToWorld,this,resultCallback);

#ifndef USE_BRUTEFORCE_RAYBROADPHASE
	m_broadphasePairCache->rayTest(rayFromWorld,rayToWorld,rayCB);
#else
	for (int i=0;i<this->getNumCollisionObjects();i++)
	{
		rayCB.process(m_collisionObjects[i]->getBroadphaseHandle());
	}	
#endif //USE_BRUTEFORCE_RAYBROADPHASE

}